

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_signature.hpp
# Opt level: O0

void chaiscript::dispatch::detail::function_signature<long_double(*)(std::__cxx11::string_const&)>
               (_func_longdouble_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                **f)

{
  _func_longdouble_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f_local;
  
  Function_Signature<long_double,chaiscript::dispatch::detail::Function_Params<std::__cxx11::string_const&>,false,false,false,false>
  ::Function_Signature<long_double(*const&)(std::__cxx11::string_const&)>
            ((Function_Signature<long_double,chaiscript::dispatch::detail::Function_Params<std::__cxx11::string_const&>,false,false,false,false>
              *)((long)&f_local + 7),f);
  return;
}

Assistant:

auto function_signature(const Func &f) {
    if constexpr (has_call_operator<Func>::value) {
      return Function_Signature<typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Return_Type,
                                typename decltype(Function_Signature{&std::decay_t<Func>::operator()})::Param_Types,
                                decltype(Function_Signature{&std::decay_t<Func>::operator()})::is_noexcept,
                                false,
                                false,
                                true>{};
    } else {
      return Function_Signature{f};
    }
  }